

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Phi(ImageInfiniteLight *this,SampledWavelengths *lambda)

{
  RGBColorSpace *cs;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  RGB *pRVar3;
  ulong uVar4;
  ulong uVar5;
  int c;
  int c_00;
  Point2i p;
  undefined1 auVar6 [64];
  undefined1 auVar10 [56];
  undefined1 extraout_var [60];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined8 in_XMM1_Qb;
  RGB RVar11;
  SampledSpectrum SVar12;
  RGB local_d8;
  ImageInfiniteLight *local_c8;
  ulong local_c0;
  Tuple2<pbrt::Point2,_int> local_b8;
  ulong local_b0;
  SampledWavelengths *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  RGB local_80;
  WrapMode2D local_70;
  SampledSpectrum sumL;
  SampledSpectrum local_58;
  undefined1 local_48 [16];
  
  auVar6 = ZEXT1664(ZEXT816(0) << 0x40);
  local_a8 = lambda;
  SampledSpectrum::SampledSpectrum(&sumL,0.0);
  local_b8 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_c0 = (ulong)local_b8 >> 0x20;
  local_90 = (ulong)(uint)(~(local_b8.x >> 0x1f) & local_b8.x);
  local_b0 = (ulong)(uint)(~(local_b8.y >> 0x1f) & local_b8.y);
  uVar4 = 0;
  local_c8 = this;
  while (uVar4 != local_b0) {
    local_a0 = uVar4 << 0x20;
    uVar5 = 0;
    local_98 = uVar4;
    while (uVar5 != local_90) {
      local_d8.r = 0.0;
      local_d8.g = 0.0;
      local_d8.b = 0.0;
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_a0 | uVar5);
      local_88 = uVar5;
      for (c_00 = 0; auVar10 = auVar6._8_56_, c_00 != 3; c_00 = c_00 + 1) {
        WrapMode2D::WrapMode2D(&local_70,OctahedralSphere);
        auVar6._0_4_ = Image::GetChannel(&this->image,p,c_00,local_70);
        auVar6._4_60_ = extraout_var;
        pRVar3 = &local_d8;
        if ((c_00 != 0) && (pRVar3 = (RGB *)&local_d8.g, c_00 != 1)) {
          pRVar3 = (RGB *)&local_d8.b;
        }
        pRVar3->r = auVar6._0_4_;
      }
      cs = local_c8->imageColorSpace;
      RVar11 = ClampZero(&local_d8);
      local_80.b = RVar11.b;
      auVar7._0_8_ = RVar11._0_8_;
      auVar7._8_56_ = auVar10;
      local_80._0_8_ = vmovlps_avx(auVar7._0_16_);
      RGBIlluminantSpectrum::RGBIlluminantSpectrum((RGBIlluminantSpectrum *)local_48,cs,&local_80);
      SVar12 = RGBIlluminantSpectrum::Sample((RGBIlluminantSpectrum *)local_48,local_a8);
      auVar8._0_8_ = SVar12.values.values._0_8_;
      auVar8._8_56_ = auVar10;
      auVar1._8_8_ = in_XMM1_Qb;
      auVar1._0_8_ = SVar12.values.values._8_8_;
      local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar1);
      auVar6 = ZEXT1664((undefined1  [16])local_58.values.values);
      SampledSpectrum::operator+=(&sumL,&local_58);
      uVar5 = local_88 + 1;
    }
    uVar4 = local_98 + 1;
  }
  auVar10 = (undefined1  [56])0x0;
  SVar12 = SampledSpectrum::operator*
                     (&sumL,local_c8->sceneRadius * local_c8->sceneRadius * 39.47842 *
                            local_c8->scale);
  auVar9._0_8_ = SVar12.values.values._0_8_;
  auVar9._8_56_ = auVar10;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar12.values.values._8_8_;
  local_48 = vmovlhps_avx(auVar9._0_16_,auVar2);
  SVar12 = SampledSpectrum::operator/
                     ((SampledSpectrum *)local_48,(float)((int)local_c0 * local_b8.x));
  return (array<float,_4>)(array<float,_4>)SVar12;
}

Assistant:

SampledSpectrum ImageInfiniteLight::Phi(const SampledWavelengths &lambda) const {
    // We're computing fluence, then converting to power...
    SampledSpectrum sumL(0.);

    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        for (int u = 0; u < width; ++u) {
            RGB rgb;
            for (int c = 0; c < 3; ++c)
                rgb[c] = image.GetChannel({u, v}, c, WrapMode::OctahedralSphere);
            sumL +=
                RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda);
        }
    }
    // Integrating over the sphere, so 4pi for that.  Then one more for Pi
    // r^2 for the area of the disk receiving illumination...
    return 4 * Pi * Pi * Sqr(sceneRadius) * scale * sumL / (width * height);
}